

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# userauth.c
# Opt level: O0

int sign_frommemory(LIBSSH2_SESSION *session,uchar **sig,size_t *sig_len,uchar *data,size_t data_len
                   ,void **abstract)

{
  int iVar1;
  size_t sStack_68;
  int rc;
  iovec datavec;
  void *hostkey_abstract;
  LIBSSH2_HOSTKEY_METHOD *privkeyobj;
  privkey_mem *pk_mem;
  void **abstract_local;
  size_t data_len_local;
  uchar *data_local;
  size_t *sig_len_local;
  uchar **sig_local;
  LIBSSH2_SESSION *session_local;
  
  privkeyobj = (LIBSSH2_HOSTKEY_METHOD *)*abstract;
  pk_mem = (privkey_mem *)abstract;
  abstract_local = (void **)data_len;
  data_len_local = (size_t)data;
  data_local = (uchar *)sig_len;
  sig_len_local = (size_t *)sig;
  sig_local = (uchar **)session;
  session_local._4_4_ =
       memory_read_privatekey
                 (session,(LIBSSH2_HOSTKEY_METHOD **)&hostkey_abstract,(void **)&datavec.iov_len,
                  session->userauth_pblc_method,session->userauth_pblc_method_len,
                  (char *)privkeyobj->hash_len,(size_t)privkeyobj->init,privkeyobj->name);
  if (session_local._4_4_ == 0) {
    if (hostkey_abstract == (void *)0x0) {
      session_local._4_4_ = -1;
    }
    else {
      sStack_68 = data_len_local;
      datavec.iov_base = abstract_local;
      iVar1 = (**(code **)((long)hostkey_abstract + 0x30))
                        (sig_local,sig_len_local,data_local,1,&stack0xffffffffffffff98,
                         &datavec.iov_len);
      if (iVar1 == 0) {
        if (*(long *)((long)hostkey_abstract + 0x40) != 0) {
          (**(code **)((long)hostkey_abstract + 0x40))(sig_local,&datavec.iov_len);
        }
        session_local._4_4_ = 0;
      }
      else {
        if (*(long *)((long)hostkey_abstract + 0x40) != 0) {
          (**(code **)((long)hostkey_abstract + 0x40))(sig_local,&datavec.iov_len);
        }
        session_local._4_4_ = -1;
      }
    }
  }
  return session_local._4_4_;
}

Assistant:

static int
sign_frommemory(LIBSSH2_SESSION *session, unsigned char **sig, size_t *sig_len,
                const unsigned char *data, size_t data_len, void **abstract)
{
    struct privkey_mem *pk_mem = (struct privkey_mem *) (*abstract);
    const LIBSSH2_HOSTKEY_METHOD *privkeyobj;
    void *hostkey_abstract;
    struct iovec datavec;
    int rc;

    rc = memory_read_privatekey(session, &privkeyobj, &hostkey_abstract,
                                session->userauth_pblc_method,
                                session->userauth_pblc_method_len,
                                pk_mem->data,
                                pk_mem->data_len,
                                pk_mem->passphrase);
    if(rc)
        return rc;

    if(!privkeyobj)
        return -1;

    libssh2_prepare_iovec(&datavec, 1);
    datavec.iov_base = (void *)LIBSSH2_UNCONST(data);
    datavec.iov_len  = data_len;

    if(privkeyobj->signv(session, sig, sig_len, 1, &datavec,
                         &hostkey_abstract)) {
        if(privkeyobj->dtor) {
            privkeyobj->dtor(session, &hostkey_abstract);
        }
        return -1;
    }

    if(privkeyobj->dtor) {
        privkeyobj->dtor(session, &hostkey_abstract);
    }
    return 0;
}